

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_dictionary.cpp
# Opt level: O2

int duckdb_brotli::AttachPreparedDictionary
              (CompoundDictionary *compound,PreparedDictionary *dictionary)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *puVar4;
  
  sVar1 = compound->num_chunks;
  iVar2 = 0;
  if (dictionary != (PreparedDictionary *)0x0 && sVar1 != 0xf) {
    sVar3 = (ulong)dictionary->source_size + compound->total_size;
    compound->total_size = sVar3;
    compound->chunks[sVar1] = dictionary;
    compound->chunk_offsets[sVar1 + 1] = sVar3;
    puVar4 = (uint8_t *)
             ((long)&dictionary[1].magic +
             (ulong)dictionary->num_items * 4 +
             (1L << ((byte)dictionary->bucket_bits & 0x3f)) * 2 +
             (1L << ((byte)dictionary->slot_bits & 0x3f)) * 4);
    if (dictionary->magic != 0xdebcede0) {
      puVar4 = *(uint8_t **)puVar4;
    }
    compound->chunk_source[sVar1] = puVar4;
    compound->num_chunks = compound->num_chunks + 1;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

BROTLI_BOOL duckdb_brotli::AttachPreparedDictionary(
    CompoundDictionary* compound, const PreparedDictionary* dictionary) {
  size_t length = 0;
  size_t index = 0;

  if (compound->num_chunks == SHARED_BROTLI_MAX_COMPOUND_DICTS) {
    return BROTLI_FALSE;
  }

  if (!dictionary) return BROTLI_FALSE;

  length = dictionary->source_size;
  index = compound->num_chunks;
  compound->total_size += length;
  compound->chunks[index] = dictionary;
  compound->chunk_offsets[index + 1] = compound->total_size;
  {
    uint32_t* slot_offsets = (uint32_t*)(&dictionary[1]);
    uint16_t* heads = (uint16_t*)(&slot_offsets[1u << dictionary->slot_bits]);
    uint32_t* items = (uint32_t*)(&heads[1u << dictionary->bucket_bits]);
    const void* tail = (void*)&items[dictionary->num_items];
    if (dictionary->magic == kPreparedDictionaryMagic) {
      compound->chunk_source[index] = (const uint8_t*)tail;
    } else {
      /* dictionary->magic == kLeanPreparedDictionaryMagic */
      compound->chunk_source[index] =
          (const uint8_t*)BROTLI_UNALIGNED_LOAD_PTR((const uint8_t**)tail);
    }
  }
  compound->num_chunks++;
  return BROTLI_TRUE;
}